

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrGLContext.cpp
# Opt level: O1

void __thiscall sglr::GLContext::genTextures(GLContext *this,int numTextures,deUint32 *textures)

{
  long lVar1;
  _Alloc_node __an;
  _Alloc_node local_38;
  
  glu::CallLogWrapper::glGenTextures(this->m_wrapper,numTextures,textures);
  if (0 < numTextures) {
    lVar1 = (ulong)(uint)numTextures << 2;
    local_38._M_t = &(this->m_allocatedTextures)._M_t;
    do {
      std::
      _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
      ::
      _M_insert_unique_<unsigned_int&,std::_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>::_Alloc_node>
                ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                  *)&this->m_allocatedTextures,
                 (const_iterator)&(this->m_allocatedTextures)._M_t._M_impl.super__Rb_tree_header,
                 textures,&local_38);
      textures = textures + 1;
      lVar1 = lVar1 + -4;
    } while (lVar1 != 0);
  }
  return;
}

Assistant:

void GLContext::genTextures (int numTextures, deUint32* textures)
{
	m_wrapper->glGenTextures(numTextures, textures);
	if (numTextures > 0)
		m_allocatedTextures.insert(textures, textures+numTextures);
}